

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O3

int fiobj_ary_remove2(FIOBJ ary,FIOBJ data)

{
  void *__dest;
  FIOBJ o;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((((ary == 0) || ((~(uint)ary & 6) == 0)) || ((ary & 1) != 0)) ||
     (*(char *)(ary & 0xfffffffffffffff8) != ')')) {
    __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                  ,0xe6,"int fiobj_ary_remove2(FIOBJ, FIOBJ)");
  }
  uVar2 = *(ulong *)(ary + 8);
  uVar3 = *(ulong *)(ary + 0x10);
  iVar1 = -1;
  uVar4 = uVar3 - uVar2;
  if (uVar4 != 0) {
    uVar5 = uVar2;
    if (uVar3 < uVar2 || uVar4 == 0) {
LAB_00140605:
      uVar6 = uVar5 - uVar2;
      if (uVar6 != 0xffffffffffffffff && uVar5 != uVar3) {
        uVar5 = 0;
        if (0 < (long)(uVar4 + uVar6)) {
          uVar5 = uVar4 + uVar6;
        }
        if (-1 < (long)uVar6) {
          uVar5 = uVar6;
        }
        if (uVar5 < uVar4) {
          uVar2 = uVar2 + uVar5;
          o = *(FIOBJ *)(*(long *)(ary + 0x20) + uVar2 * 8);
          if (uVar5 == 0) {
            *(ulong *)(ary + 8) = uVar2 + 1;
          }
          else {
            uVar3 = uVar3 - 1;
            *(ulong *)(ary + 0x10) = uVar3;
            if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
              __dest = (void *)(*(long *)(ary + 0x20) + uVar2 * 8);
              memmove(__dest,(void *)((long)__dest + 8),(uVar3 - uVar2) * 8);
            }
          }
          fiobj_free(o);
          iVar1 = 0;
        }
      }
    }
    else {
      do {
        if (*(FIOBJ *)(*(long *)(ary + 0x20) + uVar5 * 8) == data) goto LAB_00140605;
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  return iVar1;
}

Assistant:

int fiobj_ary_remove2(FIOBJ ary, FIOBJ data) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  if (-1 == fio_ary___remove2(&obj2ary(ary)->ary, data, &data)) {
    return -1;
  }
  fiobj_free(data);
  return 0;
}